

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseComponent.h
# Opt level: O0

void BaseComponent::Publish<std::__cxx11::string>
               (UserEvent<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *ev)

{
  mapped_type *this;
  size_type sVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  reference ppBVar2;
  char *pcVar3;
  size_t sVar4;
  allocator *extraout_RDX;
  ulong uVar5;
  Event *in_RDI;
  size_t i;
  Type type;
  lock_guard<std::mutex> lock;
  undefined8 uStack_a8;
  mutex_type *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  undefined8 local_30;
  UserEvent<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffffd8;
  BaseComponent *in_stack_ffffffffffffffe0;
  
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  Event::GetType(in_RDI);
  local_30 = 0;
  while( true ) {
    this = std::
           unordered_map<int,_std::vector<BaseComponent_*,_std::allocator<BaseComponent_*>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<BaseComponent_*,_std::allocator<BaseComponent_*>_>_>_>_>
           ::operator[]((unordered_map<int,_std::vector<BaseComponent_*,_std::allocator<BaseComponent_*>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<BaseComponent_*,_std::allocator<BaseComponent_*>_>_>_>_>
                         *)in_stack_ffffffffffffffb0,(key_type *)in_stack_ffffffffffffffa8);
    sVar1 = std::vector<BaseComponent_*,_std::allocator<BaseComponent_*>_>::size(this);
    if (sVar1 <= local_30) {
      std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x103f39);
      return;
    }
    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              unordered_map<int,_std::vector<BaseComponent_*,_std::allocator<BaseComponent_*>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<BaseComponent_*,_std::allocator<BaseComponent_*>_>_>_>_>
              ::operator[]((unordered_map<int,_std::vector<BaseComponent_*,_std::allocator<BaseComponent_*>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<BaseComponent_*,_std::allocator<BaseComponent_*>_>_>_>_>
                            *)in_stack_ffffffffffffffb0,(key_type *)in_stack_ffffffffffffffa8);
    uVar5 = local_30;
    in_stack_ffffffffffffffb0 = this_00;
    ppBVar2 = std::vector<BaseComponent_*,_std::allocator<BaseComponent_*>_>::operator[]
                        ((vector<BaseComponent_*,_std::allocator<BaseComponent_*>_> *)this_00,
                         local_30);
    if (*ppBVar2 == (value_type)0x0) break;
    in_stack_ffffffffffffffa8 =
         (mutex_type *)
         std::
         unordered_map<int,_std::vector<BaseComponent_*,_std::allocator<BaseComponent_*>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<BaseComponent_*,_std::allocator<BaseComponent_*>_>_>_>_>
         ::operator[]((unordered_map<int,_std::vector<BaseComponent_*,_std::allocator<BaseComponent_*>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<BaseComponent_*,_std::allocator<BaseComponent_*>_>_>_>_>
                       *)in_stack_ffffffffffffffb0,(key_type *)in_stack_ffffffffffffffa8);
    std::vector<BaseComponent_*,_std::allocator<BaseComponent_*>_>::operator[]
              ((vector<BaseComponent_*,_std::allocator<BaseComponent_*>_> *)
               in_stack_ffffffffffffffa8,local_30);
    AddEvent<std::__cxx11::string>(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    local_30 = local_30 + 1;
  }
  __cxa_rethrow();
  pcVar3 = (char *)std::__cxx11::string::_M_local_data();
  std::__cxx11::string::_Alloc_hider::_Alloc_hider((_Alloc_hider *)this_00,pcVar3,extraout_RDX);
  if (uVar5 == 0) {
    uStack_a8 = 1;
  }
  else {
    sVar4 = std::char_traits<char>::length((char_type *)0x103f9b);
    uStack_a8 = uVar5 + sVar4;
  }
  std::__cxx11::string::_M_construct<char_const*>(this_00,uVar5,uStack_a8);
  return;
}

Assistant:

static void Publish(const UserEvent<T> &ev) {
            std::lock_guard<std::mutex> lock(eventsLock);
            Event::Type type = ev.GetType();

            for(size_t i = 0; i < events[type].size(); ++i) {
                if(events[type][i] == nullptr) {
                    throw;
                }

                events[type][i]->AddEvent<T>(ev);
            }
        }